

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxin.cpp
# Opt level: O1

void __thiscall
ConfidentialTxIn_SetPeginWitnessStack_Test::TestBody
          (ConfidentialTxIn_SetPeginWitnessStack_Test *this)

{
  ByteData *pBVar1;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  lhs;
  bool bVar2;
  char *pcVar3;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_280;
  undefined1 local_278 [24];
  AssertHelper local_260 [2];
  undefined1 local_250 [16];
  AssertionResult gtest_ar;
  ByteData exp_data;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_218;
  ScriptWitness exp_witness_stack;
  ScriptWitness exp_pegin_witness;
  undefined **local_1c0;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_1b8;
  undefined **local_1a0;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_198;
  ConfidentialTxIn txin;
  
  GetExpectWitnessStack();
  GetExpectPeginWitnessStack();
  pBVar1 = &txin.super_AbstractTxIn.txid_.data_;
  txin.super_AbstractTxIn._vptr_AbstractTxIn = (_func_int **)pBVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&txin,"1234567890","");
  cfd::core::ByteData::ByteData(&exp_data,(string *)&txin);
  if ((ByteData *)txin.super_AbstractTxIn._vptr_AbstractTxIn != pBVar1) {
    operator_delete(txin.super_AbstractTxIn._vptr_AbstractTxIn);
  }
  cfd::core::ConfidentialTxIn::ConfidentialTxIn
            (&txin,&exp_txid,2,0xfffffffe,&exp_script,&exp_witness_stack,&exp_blinding_nonce,
             &exp_asset_entropy,&exp_issuance_amount,&exp_inflation_keys,
             &exp_issuance_amount_rangeproof,&exp_inflation_keys_rangeproof,&exp_pegin_witness);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::ConfidentialTxIn::SetPeginWitnessStack((uint)&local_1a0,(ByteData *)&txin);
      local_1a0 = &PTR__ScriptWitness_004e4f88;
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_198);
    }
  }
  else {
    testing::Message::Message((Message *)&local_280);
    testing::internal::AssertHelper::AssertHelper
              (local_260,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,200,
               "Expected: (txin.SetPeginWitnessStack(target_index, exp_data)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(local_260,(Message *)&local_280);
    testing::internal::AssertHelper::~AssertHelper(local_260);
    if (((local_280.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_280.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_280.ptr_ + 8))();
    }
  }
  local_280.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &PTR__ScriptWitness_004e4f88;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_278,
             &txin.pegin_witness_.witness_stack_);
  cfd::core::ScriptWitness::GetWitness();
  local_280.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &PTR__ScriptWitness_004e4f88;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_278);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  lhs.ptr_ = local_280.ptr_;
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"test_peg_vector[target_index].GetHex().c_str()",
             "exp_data.GetHex().c_str()",(char *)lhs.ptr_,(char *)local_260[0].data_);
  if (local_260[0].data_ != (AssertHelperData *)local_250) {
    operator_delete(local_260[0].data_);
  }
  if (local_280.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_278 + 8)) {
    operator_delete(local_280.ptr_);
  }
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_280);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_260,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0xcc,pcVar3);
    testing::internal::AssertHelper::operator=(local_260,(Message *)&local_280);
    testing::internal::AssertHelper::~AssertHelper(local_260);
    if (local_280.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_280.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_280.ptr_ + 8))();
      }
      local_280.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::ConfidentialTxIn::GetWitnessHash();
  cfd::core::ByteData256::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"txin.GetWitnessHash().GetHex().c_str()",
             "\"78edc6f5b6ee896fd2dca4ff75a7a23c734bf022528dad077c5570d02c2416fd\"",
             (char *)local_280.ptr_,
             "78edc6f5b6ee896fd2dca4ff75a7a23c734bf022528dad077c5570d02c2416fd");
  if (local_280.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_278 + 8)) {
    operator_delete(local_280.ptr_);
  }
  if (local_260[0].data_ != (AssertHelperData *)0x0) {
    operator_delete(local_260[0].data_);
  }
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_280);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_260,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0xcf,pcVar3);
    testing::internal::AssertHelper::operator=(local_260,(Message *)&local_280);
    testing::internal::AssertHelper::~AssertHelper(local_260);
    if (local_280.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_280.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_280.ptr_ + 8))();
      }
      local_280.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    cfd::core::ConfidentialTxIn::SetPeginWitnessStack((uint)&local_1c0,(ByteData *)&txin);
    local_1c0 = &PTR__ScriptWitness_004e4f88;
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_1b8);
  }
  testing::Message::Message((Message *)&local_280);
  testing::internal::AssertHelper::AssertHelper
            (local_260,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtxin.cpp"
             ,0xd2,
             "Expected: (txin.SetPeginWitnessStack(9, exp_data)) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(local_260,(Message *)&local_280);
  testing::internal::AssertHelper::~AssertHelper(local_260);
  if (local_280.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) &&
       (local_280.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_280.ptr_ + 8))();
    }
    local_280.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_218);
  cfd::core::ConfidentialTxIn::~ConfidentialTxIn(&txin);
  if (exp_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(exp_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  exp_pegin_witness._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_004e4f88;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            (&exp_pegin_witness.witness_stack_);
  exp_witness_stack._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_004e4f88;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            (&exp_witness_stack.witness_stack_);
  return;
}

Assistant:

TEST(ConfidentialTxIn, SetPeginWitnessStack) {
  ScriptWitness exp_witness_stack = GetExpectWitnessStack();
  ScriptWitness exp_pegin_witness = GetExpectPeginWitnessStack();
  const ByteData exp_data("1234567890");
  uint32_t target_index = 1;

  ConfidentialTxIn txin(exp_txid, exp_index, exp_sequence, exp_script,
      exp_witness_stack, exp_blinding_nonce, exp_asset_entropy,
      exp_issuance_amount, exp_inflation_keys, exp_issuance_amount_rangeproof,
      exp_inflation_keys_rangeproof, exp_pegin_witness);
  EXPECT_NO_THROW((txin.SetPeginWitnessStack(target_index, exp_data)));
  const std::vector<ByteData>& test_peg_vector = txin.GetPeginWitness()
      .GetWitness();
  EXPECT_STREQ(test_peg_vector[target_index].GetHex().c_str(),
      exp_data.GetHex().c_str());

  EXPECT_STREQ(txin.GetWitnessHash().GetHex().c_str(),
    "78edc6f5b6ee896fd2dca4ff75a7a23c734bf022528dad077c5570d02c2416fd");

  // fail case
  EXPECT_THROW((txin.SetPeginWitnessStack(9, exp_data)), CfdException);
}